

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

void __thiscall ipx::Iterate::ResidualsFromDropping(Iterate *this,double *pres,double *dres)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type vVar4;
  Int IVar5;
  const_reference pvVar6;
  double *pdVar7;
  double *pdVar8;
  double *in_RDX;
  double *in_RSI;
  int iVar9;
  undefined8 *in_RDI;
  double extraout_XMM0_Qa;
  Int p;
  double amax;
  double zdrop;
  double xdrop;
  Int j;
  double dresmax;
  double presmax;
  Vector *ub;
  Vector *lb;
  SparseMatrix *AI;
  Int n;
  Int m;
  Int in_stack_fffffffffffffeec;
  SparseMatrix *in_stack_fffffffffffffef0;
  double local_88;
  double local_80;
  double local_78;
  Int local_6c;
  double local_68;
  double local_60;
  double local_58;
  int local_4c;
  double local_48;
  double local_40;
  Vector *local_38;
  Vector *local_30;
  SparseMatrix *local_28;
  Int local_20;
  Int local_1c;
  double *local_18;
  double *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = Model::rows((Model *)*in_RDI);
  local_20 = Model::cols((Model *)*in_RDI);
  local_28 = Model::AI((Model *)*in_RDI);
  local_30 = Model::lb((Model *)*in_RDI);
  local_38 = Model::ub((Model *)*in_RDI);
  local_40 = 0.0;
  local_48 = 0.0;
  for (local_4c = 0; local_4c < local_20 + local_1c; local_4c = local_4c + 1) {
    local_58 = 0.0;
    local_60 = 0.0;
    pvVar6 = std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::
             operator[]((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                         *)(in_RDI + 0xd),(long)local_4c);
    vVar4 = *pvVar6;
    if (vVar4 == BARRIER_LB) {
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_4c);
      dVar1 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_4c);
      if (dVar1 < *pdVar7) {
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_4c);
        dVar1 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_4c);
        local_60 = dVar1 - *pdVar7;
      }
      else {
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_4c);
        dVar1 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[](local_30,(long)local_4c);
        local_58 = dVar1 - *pdVar7;
      }
    }
    else if (vVar4 == BARRIER_UB) {
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0xb),(long)local_4c);
      dVar1 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_4c);
      if (dVar1 < *pdVar7) {
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_4c);
        dVar1 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_4c);
        local_60 = dVar1 - *pdVar7;
      }
      else {
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_4c);
        dVar1 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[](local_38,(long)local_4c);
        local_58 = dVar1 - *pdVar7;
      }
    }
    else if (vVar4 == BARRIER_BOXED) {
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_4c);
      dVar1 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_4c);
      dVar2 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0xb),(long)local_4c);
      dVar3 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_4c);
      if (dVar1 / dVar2 < dVar3 / *pdVar7) {
        pdVar7 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_4c);
        dVar1 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_4c);
        if (dVar1 < *pdVar7) {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 9),(long)local_4c);
          in_stack_fffffffffffffef0 = (SparseMatrix *)*pdVar7;
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0xb),(long)local_4c);
          local_60 = (double)in_stack_fffffffffffffef0 - *pdVar7;
        }
        else {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 1),(long)local_4c);
          dVar1 = *pdVar7;
          pdVar7 = std::valarray<double>::operator[](local_38,(long)local_4c);
          local_58 = dVar1 - *pdVar7;
        }
      }
      else {
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_4c);
        dVar1 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_4c);
        if (dVar1 < *pdVar7) {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 9),(long)local_4c);
          dVar1 = *pdVar7;
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0xb),(long)local_4c);
          local_60 = dVar1 - *pdVar7;
        }
        else {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 1),(long)local_4c);
          dVar1 = *pdVar7;
          pdVar7 = std::valarray<double>::operator[](local_30,(long)local_4c);
          local_58 = dVar1 - *pdVar7;
        }
      }
    }
    local_68 = 0.0;
    local_6c = SparseMatrix::begin(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    while( true ) {
      iVar9 = (int)local_28;
      in_stack_fffffffffffffeec = local_6c;
      IVar5 = SparseMatrix::begin(in_stack_fffffffffffffef0,local_6c);
      if (IVar5 <= in_stack_fffffffffffffeec) break;
      iVar9 = (int)local_28;
      SparseMatrix::value(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      std::abs(iVar9);
      pdVar7 = std::max<double>(&local_68,&local_78);
      local_68 = *pdVar7;
      local_6c = local_6c + 1;
    }
    std::abs(iVar9);
    local_80 = extraout_XMM0_Qa * local_68;
    pdVar7 = &local_40;
    pdVar8 = std::max<double>(pdVar7,&local_80);
    local_40 = *pdVar8;
    std::abs((int)pdVar7);
    pdVar7 = std::max<double>(&local_48,&local_88);
    local_48 = *pdVar7;
  }
  if (local_10 != (double *)0x0) {
    *local_10 = local_40;
  }
  if (local_18 != (double *)0x0) {
    *local_18 = local_48;
  }
  return;
}

Assistant:

void Iterate::ResidualsFromDropping(double* pres, double* dres) const {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    double presmax = 0.0;
    double dresmax = 0.0;

    for (Int j = 0; j < n+m; j++) {
        double xdrop = 0.0;     // xnew = xold - xdrop
        double zdrop = 0.0;
        switch (variable_state_[j]) {
        case StateDetail::BARRIER_LB:
            if (zl_[j] >= xl_[j])
                xdrop = x_[j]-lb[j];   // active at lower bound
            else
                zdrop = zl_[j]-zu_[j]; // inactive
            break;
        case StateDetail::BARRIER_UB:
            if (zu_[j] >= xu_[j])
                xdrop = x_[j]-ub[j];   // active at upper bound
            else
                zdrop = zl_[j]-zu_[j]; // inactive
            break;
        case StateDetail::BARRIER_BOXED:
            if (zl_[j]/xl_[j] >= zu_[j]/xu_[j]) {
                if (zl_[j] >= xl_[j])
                    xdrop = x_[j]-lb[j];   // active at lower bound
                else
                    zdrop = zl_[j]-zu_[j]; // inactive
            } else {
                if (zu_[j] >= xu_[j])
                    xdrop = x_[j]-ub[j];   // active at upper bound
                else
                    zdrop = zl_[j]-zu_[j]; // inactive
            }
            break;
        default: ;
        }
        double amax = 0.0;
        for (Int p = AI.begin(j); p < AI.begin(j+1); p++)
            amax = std::max(amax, std::abs(AI.value(p)));
        presmax = std::max(presmax, std::abs(xdrop) * amax);
        dresmax = std::max(dresmax, std::abs(zdrop));
    }
    if (pres)
        *pres = presmax;
    if (dres)
        *dres = dresmax;
}